

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O2

void __thiscall EditorInterface::showFileDialog(EditorInterface *this,bool openFile,path *filename)

{
  element_type *peVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  size_type sVar7;
  _Link_type __z;
  Vector2f *pVVar8;
  bool recursive;
  map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  *this_00;
  float fVar9;
  float y;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar10;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  undefined1 local_a0 [32];
  locale local_80 [8];
  shared_ptr<gui::Button> fileSubmitButton;
  shared_ptr<gui::DialogBox> fileDialog;
  shared_ptr<gui::MultilineTextBox> fileTextBox;
  shared_ptr<gui::Label> fileTitle;
  
  ::gui::Widget::sendToFront
            (&(((this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_Group).super_Container.super_Widget);
  peVar1 = (this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar1->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[3])(peVar1,1);
  peVar1 = (this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::locale::locale((locale *)local_a0);
  sf::String::String((String *)&local_c8,"fileDialog",(locale *)local_a0);
  recursive = SUB81(&local_c8,0);
  ::gui::ContainerBase::getChild<gui::DialogBox>
            ((ContainerBase *)&fileDialog,(String *)peVar1,recursive);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_c8);
  std::locale::~locale((locale *)local_a0);
  peVar5 = fileDialog.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::locale::locale((locale *)local_a0);
  sf::String::String((String *)&local_c8,"fileTitle",(locale *)local_a0);
  ::gui::ContainerBase::getChild<gui::Label>((ContainerBase *)&fileTitle,(String *)peVar5,recursive)
  ;
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_c8);
  std::locale::~locale((locale *)local_a0);
  peVar6 = fileDialog.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::locale::locale((locale *)local_a0);
  sf::String::String((String *)&local_c8,"fileTextBox",(locale *)local_a0);
  ::gui::ContainerBase::getChild<gui::MultilineTextBox>
            ((ContainerBase *)&fileTextBox,(String *)peVar6,recursive);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_c8);
  std::locale::~locale((locale *)local_a0);
  peVar6 = fileDialog.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::locale::locale((locale *)local_a0);
  sf::String::String((String *)&local_c8,"fileSubmitButton",(locale *)local_a0);
  ::gui::ContainerBase::getChild<gui::Button>
            ((ContainerBase *)&fileSubmitButton,(String *)peVar6,recursive);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_c8);
  std::locale::~locale((locale *)local_a0);
  local_a0._0_8_ = this;
  if (openFile) {
    std::locale::locale((locale *)local_a0);
    sf::String::String((String *)&local_c8,"Open File",(locale *)local_a0);
    ::gui::Label::setLabel
              (fileTitle.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (String *)&local_c8);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&local_c8);
    std::locale::~locale((locale *)local_a0);
    ghc::filesystem::path::string_abi_cxx11_((string *)local_a0,filename);
    std::locale::locale(local_80);
    sf::String::String((String *)&local_c8,(string *)local_a0,local_80);
    ::gui::MultilineTextBox::setText
              (fileTextBox.super___shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(String *)&local_c8);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&local_c8);
    std::locale::~locale(local_80);
    std::__cxx11::string::~string((string *)local_a0);
    peVar4 = fileSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::locale::locale((locale *)local_a0);
    sf::String::String((String *)&local_c8,"Open",(locale *)local_a0);
    ::gui::Button::setLabel(peVar4,(String *)&local_c8);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&local_c8);
    std::locale::~locale((locale *)local_a0);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::clear(&((fileSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->onClick).callbacks_._M_t);
    this_00 = &((fileSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->onClick).callbacks_;
    local_a0._8_8_ = peVar5;
    std::__shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 0x10),
               &fileTextBox.super___shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2>);
    while( true ) {
      sVar7 = std::
              map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
              ::count(this_00,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
      if (sVar7 == 0) break;
      ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
    }
    __z = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::_M_get_node(&this_00->_M_t);
    *(int *)(__z->_M_storage)._M_storage = ::gui::priv::signalIdCounter;
    local_b8 = (code *)0x0;
    pcStack_b0 = (code *)0x0;
    local_c8._M_unused._M_object = (void *)0x0;
    local_c8._8_8_ = 0;
    local_c8._M_unused._M_object = operator_new(0x20);
    uVar3 = local_a0._24_8_;
    uVar2 = local_a0._16_8_;
    *(undefined8 *)local_c8._M_unused._0_8_ = local_a0._0_8_;
    *(undefined8 *)((long)local_c8._M_unused._0_8_ + 8) = local_a0._8_8_;
    local_a0._24_8_ = 0;
    local_a0._16_8_ = 0;
    *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x10) = uVar2;
    *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x18) = uVar3;
    pcStack_b0 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:162:43)>
                 ::_M_invoke;
    local_b8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:162:43)>
               ::_M_manager;
    ::gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>::Callback
              ((Callback<gui::Widget_*,_const_sf::Vector2<float>_&> *)
               ((__z->_M_storage)._M_storage + 8),(function<void_()> *)&local_c8);
    std::_Function_base::~_Function_base((_Function_base *)&local_c8);
    pVar10 = std::
             _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
             ::_M_get_insert_unique_pos(&this_00->_M_t,(key_type_conflict1 *)&__z->_M_storage);
    if (pVar10.second != (_Base_ptr)0x0) {
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
      ::_M_insert_node(&this_00->_M_t,pVar10.first,pVar10.second,__z);
      goto LAB_001492b6;
    }
  }
  else {
    std::locale::locale((locale *)local_a0);
    sf::String::String((String *)&local_c8,"Save As",(locale *)local_a0);
    ::gui::Label::setLabel
              (fileTitle.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (String *)&local_c8);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&local_c8);
    std::locale::~locale((locale *)local_a0);
    ghc::filesystem::path::string_abi_cxx11_((string *)local_a0,filename);
    std::locale::locale(local_80);
    sf::String::String((String *)&local_c8,(string *)local_a0,local_80);
    ::gui::MultilineTextBox::setText
              (fileTextBox.super___shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(String *)&local_c8);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&local_c8);
    std::locale::~locale(local_80);
    std::__cxx11::string::~string((string *)local_a0);
    peVar4 = fileSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::locale::locale((locale *)local_a0);
    sf::String::String((String *)&local_c8,"Save",(locale *)local_a0);
    ::gui::Button::setLabel(peVar4,(String *)&local_c8);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&local_c8);
    std::locale::~locale((locale *)local_a0);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::clear(&((fileSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->onClick).callbacks_._M_t);
    this_00 = &((fileSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->onClick).callbacks_;
    local_a0._8_8_ = peVar5;
    std::__shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 0x10),
               &fileTextBox.super___shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2>);
    while( true ) {
      sVar7 = std::
              map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
              ::count(this_00,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
      if (sVar7 == 0) break;
      ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
    }
    __z = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::_M_get_node(&this_00->_M_t);
    *(int *)(__z->_M_storage)._M_storage = ::gui::priv::signalIdCounter;
    local_b8 = (code *)0x0;
    pcStack_b0 = (code *)0x0;
    local_c8._M_unused._M_object = (void *)0x0;
    local_c8._8_8_ = 0;
    local_c8._M_unused._M_object = operator_new(0x20);
    uVar3 = local_a0._24_8_;
    uVar2 = local_a0._16_8_;
    *(undefined8 *)local_c8._M_unused._0_8_ = local_a0._0_8_;
    *(undefined8 *)((long)local_c8._M_unused._0_8_ + 8) = local_a0._8_8_;
    local_a0._24_8_ = 0;
    local_a0._16_8_ = 0;
    *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x10) = uVar2;
    *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x18) = uVar3;
    pcStack_b0 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:174:43)>
                 ::_M_invoke;
    local_b8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:174:43)>
               ::_M_manager;
    ::gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>::Callback
              ((Callback<gui::Widget_*,_const_sf::Vector2<float>_&> *)
               ((__z->_M_storage)._M_storage + 8),(function<void_()> *)&local_c8);
    std::_Function_base::~_Function_base((_Function_base *)&local_c8);
    pVar10 = std::
             _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
             ::_M_get_insert_unique_pos(&this_00->_M_t,(key_type_conflict1 *)&__z->_M_storage);
    if (pVar10.second != (_Base_ptr)0x0) {
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
      ::_M_insert_node(&this_00->_M_t,pVar10.first,pVar10.second,__z);
      goto LAB_001492b6;
    }
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  ::_M_drop_node(&this_00->_M_t,__z);
LAB_001492b6:
  ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 0x18));
  peVar5 = fileDialog.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pVVar8 = ::gui::DialogBox::getSize
                     (fileDialog.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  ::gui::DialogBox::setSize(peVar5,pVVar8);
  (*((fileDialog.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Group
    ).super_Container.super_ContainerBase._vptr_ContainerBase[3])
            (fileDialog.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
  pVVar8 = ::gui::Panel::getSize
                     ((this->modalBackground_).
                      super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  fVar9 = pVVar8->x;
  pVVar8 = ::gui::Panel::getSize
                     ((this->modalBackground_).
                      super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  fVar9 = fVar9 * 0.5;
  if (80.0 <= fVar9) {
    fVar9 = 80.0;
  }
  y = pVVar8->y * 0.5;
  if (80.0 <= y) {
    y = 80.0;
  }
  ::gui::Widget::setPosition
            (&((fileDialog.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_Group).super_Container.super_Widget,fVar9,y);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fileSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fileTextBox.super___shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fileTitle.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fileDialog.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

void EditorInterface::showFileDialog(bool openFile, const fs::path& filename) {
    modalBackground_->sendToFront();
    modalBackground_->setVisible(true);
    auto fileDialog = modalBackground_->getChild<gui::DialogBox>("fileDialog");
    auto fileDialogPtr = fileDialog.get();
    auto fileTitle = fileDialog->getChild<gui::Label>("fileTitle");
    auto fileTextBox = fileDialog->getChild<gui::MultilineTextBox>("fileTextBox");
    auto fileSubmitButton = fileDialog->getChild<gui::Button>("fileSubmitButton");

    if (openFile) {
        fileTitle->setLabel("Open File");
        fileTextBox->setText(filename.string());
        fileSubmitButton->setLabel("Open");
        fileSubmitButton->onClick.disconnectAll();
        fileSubmitButton->onClick.connect([this,fileDialogPtr,fileTextBox]() {
            fileDialogPtr->setVisible(false);
            modalBackground_->setVisible(false);
            if (!fileTextBox->getText().isEmpty()) {
                editor_.openBoard(true, fileTextBox->getText().toAnsiString());
            }
        });
    } else {
        fileTitle->setLabel("Save As");
        fileTextBox->setText(filename.string());
        fileSubmitButton->setLabel("Save");
        fileSubmitButton->onClick.disconnectAll();
        fileSubmitButton->onClick.connect([this,fileDialogPtr,fileTextBox]() {
            fileDialogPtr->setVisible(false);
            modalBackground_->setVisible(false);
            if (!fileTextBox->getText().isEmpty()) {
                editor_.saveAsBoard(fileTextBox->getText().toAnsiString());
            }
        });
    }

    // Force dialog to reposition widgets since labels changed.
    fileDialog->setSize(fileDialog->getSize());

    fileDialog->setVisible(true);
    fileDialog->setPosition(
        std::min(80.0f, modalBackground_->getSize().x / 2.0f),
        std::min(80.0f, modalBackground_->getSize().y / 2.0f)
    );
}